

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::(anonymous_namespace)::PluginName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view plugin_prefix,
          string_view directive)

{
  string_view pc;
  size_type sVar1;
  AlphaNum *c;
  basic_string_view<char,_std::char_traits<char>_> pc_00;
  AlphaNum local_d0;
  AlphaNum local_a0;
  _anonymous_namespace_ *local_70;
  char *local_68;
  AlphaNum local_60;
  undefined1 local_30 [8];
  string_view directive_local;
  string_view plugin_prefix_local;
  
  local_30 = (undefined1  [8])plugin_prefix._M_str;
  local_68 = (char *)plugin_prefix._M_len;
  c = (AlphaNum *)directive._M_len;
  pc._M_str = local_68;
  pc._M_len = (size_t)this;
  local_70 = this;
  directive_local._M_len = (size_t)c;
  directive_local._M_str = (char *)this;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_60,pc);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_a0,"gen-");
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
  pc_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_30,2,sVar1 - 6);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_d0,pc_00);
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_60,&local_a0,&local_d0,c);
  return __return_storage_ptr__;
}

Assistant:

std::string PluginName(absl::string_view plugin_prefix,
                       absl::string_view directive) {
  // Assuming the directive starts with "--" and ends with "_out" or "_opt",
  // strip the "--" and "_out/_opt" and add the plugin prefix.
  return absl::StrCat(plugin_prefix, "gen-",
                      directive.substr(2, directive.size() - 6));
}